

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

Token * Assimp::FBX::GetRequiredToken(Element *el,uint index)

{
  ulong uVar1;
  size_type sVar2;
  basic_formatter *this;
  const_reference ppTVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1b8 [376];
  string local_40;
  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *local_20;
  TokenList *t;
  Element *pEStack_10;
  uint index_local;
  Element *el_local;
  
  t._4_4_ = index;
  pEStack_10 = el;
  local_20 = Element::Tokens(el);
  uVar1 = (ulong)t._4_4_;
  sVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::size
                    (local_20);
  if (sVar2 <= uVar1) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[24]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
               (char (*) [24])"missing token at index ");
    this = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (local_1b8,(uint *)((long)&t + 4));
    Formatter::basic_formatter::operator_cast_to_string(&local_40,this);
    anon_unknown.dwarf_d3af7e::ParseError(&local_40,pEStack_10);
  }
  ppTVar3 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            operator[](local_20,(ulong)t._4_4_);
  return *ppTVar3;
}

Assistant:

const Token& GetRequiredToken(const Element& el, unsigned int index)
{
    const TokenList& t = el.Tokens();
    if(index >= t.size()) {
        ParseError(Formatter::format( "missing token at index " ) << index,&el);
    }

    return *t[index];
}